

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult __thiscall
VmaDefragmentationContext_T::DefragmentPassBegin
          (VmaDefragmentationContext_T *this,VmaDefragmentationPassMoveInfo *moveInfo)

{
  uint32_t uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  VmaDefragmentationMove *pVVar5;
  char cVar6;
  VmaBlockVector *pVVar7;
  size_t index;
  pthread_rwlock_t *__rwlock;
  
  pVVar7 = this->m_PoolBlockVector;
  if (pVVar7 == (VmaBlockVector *)0x0) {
    if (this->m_BlockVectorCount != 0) {
      index = 0;
      do {
        pVVar7 = this->m_pBlockVectors[index];
        if (pVVar7 != (VmaBlockVector *)0x0) {
          __rwlock = (pthread_rwlock_t *)&pVVar7->m_Mutex;
          cVar6 = pVVar7->m_hAllocator->m_UseMutex;
          if ((bool)cVar6 == true) {
            iVar4 = pthread_rwlock_wrlock(__rwlock);
            if (iVar4 == 0x23) goto LAB_001bc9b3;
            pVVar7 = this->m_pBlockVectors[index];
          }
          uVar2 = (pVVar7->m_Blocks).m_Count;
          if (uVar2 < 2) {
            if (uVar2 == 1) {
              bVar3 = ReallocWithinBlock(this,pVVar7,*(pVVar7->m_Blocks).m_pArray);
              goto LAB_001bc942;
            }
          }
          else {
            bVar3 = ComputeDefragmentation(this,pVVar7,index);
LAB_001bc942:
            if (bVar3 != false) goto LAB_001bc97d;
          }
          if ((bool)cVar6 != false) {
            pthread_rwlock_unlock(__rwlock);
          }
        }
        index = index + 1;
      } while (index < this->m_BlockVectorCount);
    }
  }
  else {
    __rwlock = (pthread_rwlock_t *)&pVVar7->m_Mutex;
    cVar6 = pVVar7->m_hAllocator->m_UseMutex;
    if ((bool)cVar6 == true) {
      iVar4 = pthread_rwlock_wrlock(__rwlock);
      if (iVar4 == 0x23) {
LAB_001bc9b3:
        std::__throw_system_error(0x23);
      }
      pVVar7 = this->m_PoolBlockVector;
    }
    uVar2 = (pVVar7->m_Blocks).m_Count;
    if (uVar2 < 2) {
      if (uVar2 == 1) {
        ReallocWithinBlock(this,pVVar7,*(pVVar7->m_Blocks).m_pArray);
      }
    }
    else {
      ComputeDefragmentation(this,pVVar7,0);
    }
LAB_001bc97d:
    if (cVar6 != '\0') {
      pthread_rwlock_unlock(__rwlock);
    }
  }
  uVar1 = (uint32_t)(this->m_Moves).m_Count;
  moveInfo->moveCount = uVar1;
  if (uVar1 == 0) {
    pVVar5 = (VmaDefragmentationMove *)0x0;
  }
  else {
    pVVar5 = (this->m_Moves).m_pArray;
  }
  moveInfo->pMoves = pVVar5;
  return (uint)(uVar1 != 0) * 5;
}

Assistant:

VkResult VmaDefragmentationContext_T::DefragmentPassBegin(VmaDefragmentationPassMoveInfo& moveInfo)
{
    if (m_PoolBlockVector != VMA_NULL)
    {
        VmaMutexLockWrite lock(m_PoolBlockVector->GetMutex(), m_PoolBlockVector->GetAllocator()->m_UseMutex);

        if (m_PoolBlockVector->GetBlockCount() > 1)
            ComputeDefragmentation(*m_PoolBlockVector, 0);
        else if (m_PoolBlockVector->GetBlockCount() == 1)
            ReallocWithinBlock(*m_PoolBlockVector, m_PoolBlockVector->GetBlock(0));
    }
    else
    {
        for (uint32_t i = 0; i < m_BlockVectorCount; ++i)
        {
            if (m_pBlockVectors[i] != VMA_NULL)
            {
                VmaMutexLockWrite lock(m_pBlockVectors[i]->GetMutex(), m_pBlockVectors[i]->GetAllocator()->m_UseMutex);

                if (m_pBlockVectors[i]->GetBlockCount() > 1)
                {
                    if (ComputeDefragmentation(*m_pBlockVectors[i], i))
                        break;
                }
                else if (m_pBlockVectors[i]->GetBlockCount() == 1)
                {
                    if (ReallocWithinBlock(*m_pBlockVectors[i], m_pBlockVectors[i]->GetBlock(0)))
                        break;
                }
            }
        }
    }

    moveInfo.moveCount = static_cast<uint32_t>(m_Moves.size());
    if (moveInfo.moveCount > 0)
    {
        moveInfo.pMoves = m_Moves.data();
        return VK_INCOMPLETE;
    }

    moveInfo.pMoves = VMA_NULL;
    return VK_SUCCESS;
}